

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O1

void __thiscall adios2::format::BP5Deserializer::~BP5Deserializer(BP5Deserializer *this,void **vtt)

{
  ControlInfo *__ptr;
  ControlInfo *pCVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  pointer puVar3;
  IO *this_00;
  _Hash_node_base *p_Var4;
  vector<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
  *this_01;
  pointer pSVar5;
  vector<void_*,_std::allocator<void_*>_> *pvVar6;
  pointer ppvVar7;
  pointer ppvVar8;
  pointer pvVar9;
  pointer ppuVar10;
  unsigned_long **p;
  _Hash_node_base *p_Var11;
  pointer ppuVar12;
  vector<void_*,_std::allocator<void_*>_> **step;
  pointer ppvVar13;
  pointer pvVar14;
  allocator local_51;
  string local_50;
  
  this->_vptr_BP5Deserializer = (_func_int **)*vtt;
  __ptr = this->ControlBlocks;
  free_FFSContext(this->ReaderFFSContext);
  this->ControlBlocks = (ControlInfo *)0x0;
  while (__ptr != (ControlInfo *)0x0) {
    pCVar1 = __ptr->Next;
    pvVar2 = __ptr->MetaFieldOffset;
    if (pvVar2 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
      puVar3 = (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      operator_delete(pvVar2);
    }
    pvVar2 = __ptr->CIVarIndex;
    if (pvVar2 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
      puVar3 = (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      operator_delete(pvVar2);
    }
    free(__ptr);
    __ptr = pCVar1;
  }
  p_Var11 = (this->VarByName)._M_h._M_before_begin._M_nxt;
  if (p_Var11 != (_Hash_node_base *)0x0) {
    do {
      this_00 = this->m_Engine->m_IO;
      std::__cxx11::string::string
                ((string *)&local_50,(char *)p_Var11[5]._M_nxt[3]._M_nxt,&local_51);
      core::IO::RemoveVariable(this_00,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      free(p_Var11[5]._M_nxt[3]._M_nxt);
      p_Var4 = p_Var11[5]._M_nxt[9]._M_nxt;
      if (p_Var4 != (_Hash_node_base *)0x0) {
        free(p_Var4);
      }
      p_Var4 = p_Var11[5]._M_nxt[0xd]._M_nxt;
      if (p_Var4 != (_Hash_node_base *)0x0) {
        free(p_Var4);
      }
      this_01 = (vector<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                 *)p_Var11[5]._M_nxt[0xb]._M_nxt;
      if (this_01 !=
          (vector<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
           *)0x0) {
        pSVar5 = this_01[1].
                 super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pSVar5 != (pointer)(this_01 + 2)) {
          operator_delete(pSVar5);
        }
        std::
        vector<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
        ::~vector(this_01);
        operator_delete(this_01);
      }
      p_Var4 = p_Var11[5]._M_nxt;
      if (p_Var4 != (_Hash_node_base *)0x0) {
        if (p_Var4[0x17]._M_nxt != (_Hash_node_base *)0x0) {
          operator_delete(p_Var4[0x17]._M_nxt);
        }
        if (p_Var4[0x14]._M_nxt != (_Hash_node_base *)0x0) {
          operator_delete(p_Var4[0x14]._M_nxt);
        }
        operator_delete(p_Var4);
      }
      p_Var11 = p_Var11->_M_nxt;
    } while (p_Var11 != (_Hash_node_base *)0x0);
  }
  pvVar6 = this->m_FreeableMBA;
  if (pvVar6 != (vector<void_*,_std::allocator<void_*>_> *)0x0) {
    ppvVar7 = (pvVar6->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppvVar7 != (pointer)0x0) {
      operator_delete(ppvVar7);
    }
    operator_delete(pvVar6);
  }
  ppvVar8 = (this->MetadataBaseArray).
            super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppvVar13 = (this->MetadataBaseArray).
                  super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppvVar13 != ppvVar8;
      ppvVar13 = ppvVar13 + 1) {
    pvVar6 = *ppvVar13;
    if (pvVar6 != (vector<void_*,_std::allocator<void_*>_> *)0x0) {
      ppvVar7 = (pvVar6->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (ppvVar7 != (pointer)0x0) {
        operator_delete(ppvVar7);
      }
      operator_delete(pvVar6);
    }
  }
  pvVar9 = (this->JoinedDimArray).
           super__Vector_base<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar14 = (this->JoinedDimArray).
                 super__Vector_base<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar14 != pvVar9; pvVar14 = pvVar14 + 1
      ) {
    ppuVar10 = (pvVar14->super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    for (ppuVar12 = (pvVar14->super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>)
                    ._M_impl.super__Vector_impl_data._M_start; ppuVar12 != ppuVar10;
        ppuVar12 = ppuVar12 + 1) {
      if (*ppuVar12 != (unsigned_long *)0x0) {
        free(*ppuVar12);
      }
    }
  }
  std::
  vector<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>
  ::~vector(&this->JoinedDimArray);
  ppvVar13 = (this->MetadataBaseArray).
             super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppvVar13 != (pointer)0x0) {
    operator_delete(ppvVar13);
  }
  std::
  vector<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
  ::~vector(&this->m_ControlArray);
  std::
  _Hashtable<void_*,_std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>,_std::allocator<std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->VarByKey)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->VarByName)._M_h);
  puVar3 = (this->m_WriterCohortSize).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  std::
  vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  ::~vector(&this->PendingGetRequests);
  return;
}

Assistant:

BP5Deserializer::~BP5Deserializer()
{
    struct ControlInfo *tmp = ControlBlocks;
    free_FFSContext(ReaderFFSContext);
    ControlBlocks = NULL;
    while (tmp)
    {
        struct ControlInfo *next = tmp->Next;
        delete tmp->MetaFieldOffset;
        delete tmp->CIVarIndex;
        free(tmp);
        tmp = next;
    }
    for (auto &VarRec : VarByName)
    {
        /* remove any variables that we've created from our IO */
        m_Engine->m_IO.RemoveVariable(VarRec.second->VarName);
#ifdef ADIOS2_HAVE_DERIVED_VARIABLE
        m_Engine->m_IO.RemoveDerivedVariable(VarRec.second->VarName);
#endif

        free(VarRec.second->VarName);
        if (VarRec.second->ExprStr)
            free(VarRec.second->ExprStr);
        if (VarRec.second->Operator)
            free(VarRec.second->Operator);
        if (VarRec.second->Def)
            delete VarRec.second->Def;
        delete VarRec.second;
    }
    if (m_FreeableMBA)
    {
        delete m_FreeableMBA;
    }
    for (auto &step : MetadataBaseArray)
    {
        delete step;
    }
    for (auto &pvec : JoinedDimArray)
    {
        for (auto &p : pvec)
        {
            if (p)
            {
                free(p);
            }
        }
    }
}